

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::MeshLoader::appendVertexValues
          (MeshLoader *this,SourceBase *sourceBase,MeshVertexData *vertexData)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  
  sVar2 = COLLADAFW::FloatOrDoubleArray::getValuesCount(&vertexData->super_FloatOrDoubleArray);
  sourceBase->mInitialIndex = sVar2;
  iVar1 = (*sourceBase->_vptr_SourceBase[2])(sourceBase);
  if (iVar1 == 3) {
    COLLADAFW::MeshVertexData::appendValues
              (vertexData,(DoubleArray *)&sourceBase[1].mLoadedInputElements.mFlags,&sourceBase->mId
               ,sourceBase->mStride);
  }
  else {
    if (iVar1 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Source has an other datatype as float or double! ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      std::endl<char,std::char_traits<char>>(poVar3);
      return false;
    }
    COLLADAFW::MeshVertexData::appendValues
              (vertexData,(FloatArray *)&sourceBase[1].mLoadedInputElements.mFlags,&sourceBase->mId,
               sourceBase->mStride);
  }
  return true;
}

Assistant:

bool MeshLoader::appendVertexValues ( 
        SourceBase* sourceBase, 
        COLLADAFW::MeshVertexData &vertexData )
    {
        bool retValue = true;

        // Check if there are already some values in the positions list.
        // If so, we have to store the last index to increment the following indexes.
        const size_t initialIndex = vertexData.getValuesCount ();
        sourceBase->setInitialIndex ( initialIndex );

        // Get the source input array
        const SourceBase::DataType& dataType = sourceBase->getDataType ();
        switch ( dataType )
        {
        case SourceBase::DATA_TYPE_FLOAT:
            {
                // Get the values array from the source
                FloatSource* source = ( FloatSource* ) sourceBase;
                FloatArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<float>& valuesArray = arrayElement.getValues ();

                // Push the values with the infos into the list.
                vertexData.appendValues ( valuesArray, source->getId (), (size_t) source->getStride () );

                break;  
            }
        case SourceBase::DATA_TYPE_DOUBLE:
            {
                // Get the values array from the source
                DoubleSource* source = ( DoubleSource* ) sourceBase;
                DoubleArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<double>& valuesArray = arrayElement.getValues ();

                // Push the values with the infos into the list.
                vertexData.appendValues ( valuesArray, source->getId (), (size_t) source->getStride () );

                break;
            }
        default:
            std::cerr << "Source has an other datatype as float or double! " << dataType << std::endl;
            retValue = false;
        }

        return retValue;
    }